

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

void __thiscall
cmLinkLineComputer::ComputeLinkPath
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,string *libPathFlag,
          string *libPathTerminator,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  ItemVector *pIVar5;
  pointer pIVar6;
  _Alloc_hider _Var7;
  string linkPathNoBT;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> libDir;
  undefined1 local_140 [48];
  string local_110;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f0;
  string local_c0;
  cmAlphaNum local_a0;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_f0,(string *)&cli->LinkLanguage);
  bVar3 = std::operator==(&local_f0.Value,"Swift");
  std::__cxx11::string::~string((string *)&local_f0);
  if (bVar3) {
    local_140._0_8_ = local_140 + 0x10;
    local_140._8_8_ = (pointer)0x0;
    local_140[0x10] = '\0';
    pIVar5 = cmComputeLinkInformation::GetItems(cli);
    pIVar1 = (pIVar5->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar6 = (pIVar5->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar1; pIVar6 = pIVar6 + 1)
    {
      pcVar2 = pIVar6->Target;
      if (pcVar2 != (cmGeneratorTarget *)0x0) {
        TVar4 = cmGeneratorTarget::GetType(pcVar2);
        if (TVar4 != STATIC_LIBRARY) {
          TVar4 = cmGeneratorTarget::GetType(pcVar2);
          if (TVar4 != SHARED_LIBRARY) goto LAB_002235b2;
        }
        std::__cxx11::string::string((string *)&local_f0,(string *)&cli->Config);
        bVar3 = cmGeneratorTarget::HasImportLibrary(pcVar2,&local_f0.Value);
        std::__cxx11::string::~string((string *)&local_f0);
        local_f0.Value._M_dataplus._M_p = &DAT_00000001;
        local_f0.Value._M_string_length = 0x63e126;
        local_a0.View_._M_str = (libPathFlag->_M_dataplus)._M_p;
        local_a0.View_._M_len = libPathFlag->_M_string_length;
        pcVar2 = pIVar6->Target;
        std::__cxx11::string::string((string *)&local_70,(string *)&cli->Config);
        cmGeneratorTarget::GetDirectory(&local_110,pcVar2,&local_70,(uint)bVar3);
        ConvertToOutputForExisting(&local_c0,this,&local_110);
        cmStrCat<std::__cxx11::string,std::__cxx11::string,char[2]>
                  (&local_50,(cmAlphaNum *)&local_f0,&local_a0,&local_c0,libPathTerminator,
                   (char (*) [2])0x63e126);
        std::__cxx11::string::append((string *)local_140);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_70);
      }
LAB_002235b2:
    }
    if ((pointer)local_140._8_8_ != (pointer)0x0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 linkPath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_140);
    }
    std::__cxx11::string::~string((string *)local_140);
  }
  cmComputeLinkInformation::GetDirectoriesWithBacktraces_abi_cxx11_
            ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_110,cli);
  for (_Var7._M_p = local_110._M_dataplus._M_p; _Var7._M_p != (pointer)local_110._M_string_length;
      _Var7._M_p = _Var7._M_p + 0x30) {
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_f0,
               (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)_Var7._M_p);
    local_a0.View_._M_len = 1;
    local_a0.View_._M_str = " ";
    local_140._8_8_ = (libPathFlag->_M_dataplus)._M_p;
    local_140._0_8_ = libPathFlag->_M_string_length;
    ConvertToOutputForExisting(&local_c0,this,&local_f0.Value);
    cmStrCat<std::__cxx11::string,std::__cxx11::string,char[2]>
              (&local_50,&local_a0,(cmAlphaNum *)local_140,&local_c0,libPathTerminator,
               (char (*) [2])0x63e126);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<BT<std::__cxx11::string>&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)linkPath
               ,&local_f0);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_f0);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_110);
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkPath(
  cmComputeLinkInformation& cli, std::string const& libPathFlag,
  std::string const& libPathTerminator, std::vector<BT<std::string>>& linkPath)
{
  if (cli.GetLinkLanguage() == "Swift") {
    std::string linkPathNoBT;

    for (const cmComputeLinkInformation::Item& item : cli.GetItems()) {
      const cmGeneratorTarget* target = item.Target;
      if (!target) {
        continue;
      }

      if (target->GetType() == cmStateEnums::STATIC_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        cmStateEnums::ArtifactType type = cmStateEnums::RuntimeBinaryArtifact;
        if (target->HasImportLibrary(cli.GetConfig())) {
          type = cmStateEnums::ImportLibraryArtifact;
        }

        linkPathNoBT +=
          cmStrCat(" ", libPathFlag,
                   this->ConvertToOutputForExisting(
                     item.Target->GetDirectory(cli.GetConfig(), type)),
                   libPathTerminator, " ");
      }
    }

    if (!linkPathNoBT.empty()) {
      linkPath.emplace_back(std::move(linkPathNoBT));
    }
  }

  for (BT<std::string> libDir : cli.GetDirectoriesWithBacktraces()) {
    libDir.Value = cmStrCat(" ", libPathFlag,
                            this->ConvertToOutputForExisting(libDir.Value),
                            libPathTerminator, " ");
    linkPath.emplace_back(libDir);
  }
}